

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Core.cpp
# Opt level: O0

void __thiscall RenX::Core::~Core(Core *this)

{
  Core *this_local;
  
  ~Core(this);
  operator_delete(this,0x138);
  return;
}

Assistant:

RenX::Core::~Core() {
}